

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

void envy_bios_print_hdtvtt(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_hdtvtt *peVar1;
  envy_bios_hdtvtt_entry *entry;
  int i;
  envy_bios_hdtvtt *hdtvtt;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->hdtvtt;
  if ((peVar1->offset != 0) && ((mask & 0x400000) != 0)) {
    if ((bios->hdtvtt).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse HDTVTT table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->hdtvtt).version >> 4),
              (ulong)((bios->hdtvtt).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"HDTVTT table at 0x%04x version %d.%d\n",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->hdtvtt).version >> 4),
              (ulong)((bios->hdtvtt).version & 0xf));
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->hdtvtt).hlen,mask);
      for (entry._4_4_ = 0; entry._4_4_ < (int)(uint)(bios->hdtvtt).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        envy_bios_dump_hex(bios,out,(uint)(bios->hdtvtt).entries[entry._4_4_].offset,
                           (uint)(bios->hdtvtt).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_hdtvtt (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!hdtvtt->valid) {
		fprintf(out, "Failed to parse HDTVTT table at 0x%04x version %d.%d\n\n", hdtvtt->offset, hdtvtt->version >> 4, hdtvtt->version & 0xf);
		return;
	}
	fprintf(out, "HDTVTT table at 0x%04x version %d.%d\n", hdtvtt->offset, hdtvtt->version >> 4, hdtvtt->version & 0xf);
	envy_bios_dump_hex(bios, out, hdtvtt->offset, hdtvtt->hlen, mask);
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		envy_bios_dump_hex(bios, out, entry->offset, hdtvtt->rlen, mask);
	}
	fprintf(out, "\n");
}